

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDIOAnalyzer.cpp
# Opt level: O0

void __thiscall SDIOAnalyzer::SetupResults(SDIOAnalyzer *this)

{
  SDIOAnalyzerResults *this_00;
  pointer settings;
  pointer pSVar1;
  SDIOAnalyzer *this_local;
  
  this_00 = (SDIOAnalyzerResults *)operator_new(0x20);
  settings = std::unique_ptr<SDIOAnalyzerSettings,_std::default_delete<SDIOAnalyzerSettings>_>::get
                       (&this->mSettings);
  SDIOAnalyzerResults::SDIOAnalyzerResults(this_00,this,settings);
  std::unique_ptr<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>::reset
            (&this->mResults,this_00);
  std::unique_ptr<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>::get
            (&this->mResults);
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  pSVar1 = std::unique_ptr<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>::
           operator->(&this->mResults);
  std::unique_ptr<SDIOAnalyzerSettings,_std::default_delete<SDIOAnalyzerSettings>_>::operator->
            (&this->mSettings);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)pSVar1);
  return;
}

Assistant:

void SDIOAnalyzer::SetupResults()
{
    mResults.reset( new SDIOAnalyzerResults( this, mSettings.get() ) );
    SetAnalyzerResults( mResults.get() );

    // mResults->AddChannelBubblesWillAppearOn(mSettings->mClockChannel);
    mResults->AddChannelBubblesWillAppearOn( mSettings->mCmdChannel );
    // mResults->AddChannelBubblesWillAppearOn(mSettings->mDAT0Channel);
    // mResults->AddChannelBubblesWillAppearOn(mSettings->mDAT1Channel);
    // mResults->AddChannelBubblesWillAppearOn(mSettings->mDAT2Channel);
    // mResults->AddChannelBubblesWillAppearOn(mSettings->mDAT3Channel);
}